

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReaderCache::getStats(PtexReaderCache *this,Stats *stats)

{
  uint32_t uVar1;
  undefined8 *in_RSI;
  long in_RDI;
  long local_20;
  
  *in_RSI = *(undefined8 *)(in_RDI + 0x90);
  in_RSI[1] = *(undefined8 *)(in_RDI + 0x4b0);
  in_RSI[2] = *(undefined8 *)(in_RDI + 0xd0);
  in_RSI[3] = *(undefined8 *)(in_RDI + 0x4b8);
  uVar1 = PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::size
                    ((PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *)
                     (in_RDI + 0x60));
  in_RSI[4] = (ulong)uVar1;
  if (*(ulong *)(in_RDI + 0x4c0) < (ulong)in_RSI[4]) {
    local_20 = 0;
  }
  else {
    local_20 = *(long *)(in_RDI + 0x4c0) - in_RSI[4];
  }
  in_RSI[5] = local_20;
  in_RSI[6] = *(undefined8 *)(in_RDI + 0x4c8);
  return;
}

Assistant:

void PtexReaderCache::getStats(Stats& stats)
{
    stats.memUsed = _memUsed;
    stats.peakMemUsed = _peakMemUsed;
    stats.filesOpen = _filesOpen;
    stats.peakFilesOpen = _peakFilesOpen;
    stats.filesAccessed = _files.size();
    stats.fileReopens = _fileOpens < stats.filesAccessed ? 0 : _fileOpens - stats.filesAccessed;
    stats.blockReads = _blockReads;
}